

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sym_tbl.cpp
# Opt level: O3

shared_ptr<mocker::ast::Declaration> __thiscall
mocker::SymTbl::lookUp(SymTbl *this,ScopeID *scopeID,string *identifier)

{
  int iVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  int iVar2;
  iterator iVar3;
  key_type *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  element_type *extraout_RDX;
  element_type *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  element_type *peVar6;
  bool bVar7;
  shared_ptr<mocker::SymTbl::Scope> sVar8;
  shared_ptr<mocker::ast::Declaration> sVar9;
  shared_ptr<mocker::SymTbl::Scope> cur;
  SymTbl local_28;
  
  sVar8 = getScope(&local_28,scopeID);
  _Var5._M_pi = sVar8.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi._M_pi;
  do {
    if (local_28.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        == (element_type *)0x0) {
      (this->root).super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (this->root).super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_00191263:
      if (local_28.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_28.root.
                   super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
        _Var5._M_pi = extraout_RDX_01;
      }
      sVar9.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = _Var5._M_pi;
      sVar9.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (shared_ptr<mocker::ast::Declaration>)
             sVar9.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>;
    }
    iVar3 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ast::Declaration>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ast::Declaration>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ast::Declaration>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ast::Declaration>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)local_28.root.
                      super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   in_RCX);
    this_00._M_pi =
         local_28.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (iVar3.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ast::Declaration>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      (this->root).super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)
            ((long)iVar3.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ast::Declaration>_>,_true>
                   ._M_cur + 0x28);
      p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                ((long)iVar3.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ast::Declaration>_>,_true>
                       ._M_cur + 0x30);
      (this->root).super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = p_Var4;
      _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        }
      }
      goto LAB_00191263;
    }
    p_Var4 = ((local_28.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->pnt).super___weak_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var4 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_00191238:
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_0019123a:
      peVar6 = (element_type *)0x0;
    }
    else {
      iVar2 = p_Var4->_M_use_count;
      do {
        if (iVar2 == 0) goto LAB_00191238;
        LOCK();
        iVar1 = p_Var4->_M_use_count;
        bVar7 = iVar2 == iVar1;
        if (bVar7) {
          p_Var4->_M_use_count = iVar2 + 1;
          iVar1 = iVar2;
        }
        iVar2 = iVar1;
        UNLOCK();
      } while (!bVar7);
      if (p_Var4->_M_use_count == 0) goto LAB_0019123a;
      peVar6 = ((local_28.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->pnt).super___weak_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
    }
    bVar7 = local_28.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_28.root.
                  super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_28.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar6;
    local_28.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var4;
    if (bVar7) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
      _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_00;
    }
  } while( true );
}

Assistant:

std::shared_ptr<ast::Declaration>
SymTbl::lookUp(const ScopeID &scopeID, const std::string &identifier) const {
  auto cur = getScope(scopeID);
  while (cur != nullptr) {
    auto iter = cur->syms.find(identifier);
    if (iter != cur->syms.end())
      return {iter->second};
    cur = cur->pnt.lock();
  }
  return {};
}